

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O3

void __thiscall
lf::geometry::Parallelogram::Parallelogram
          (Parallelogram *this,Matrix<double,__1,_4,_0,__1,_4> *coords)

{
  Matrix<double,__1,_4,_0,__1,_4> *coords_00;
  pointer pcVar1;
  Index IVar2;
  Scalar SVar3;
  Scalar SVar4;
  long lVar5;
  pointer pcVar6;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  *func;
  undefined8 *puVar7;
  byte bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  stringstream ss;
  undefined1 local_5c9 [9];
  undefined1 local_5c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0 [6];
  Lhs local_548;
  Lhs local_510;
  undefined1 local_4d8 [192];
  undefined1 local_418 [136];
  PointerType local_390;
  variable_if_dynamic<long,__1> vStack_388;
  undefined8 local_380;
  XprTypeNested pMStack_378;
  variable_if_dynamic<long,__1> local_370;
  variable_if_dynamic<long,__1> vStack_368;
  Index local_360;
  PointerType local_350;
  variable_if_dynamic<long,__1> vStack_348;
  undefined8 local_340;
  XprTypeNested pMStack_338;
  variable_if_dynamic<long,__1> local_330;
  variable_if_dynamic<long,__1> vStack_328;
  Index local_320;
  Rhs local_310;
  Rhs local_2d8;
  Rhs local_2a0;
  Rhs local_268;
  scalar_difference_op<double,_double> local_230 [8];
  undefined8 local_228;
  ostream local_220 [8];
  undefined8 local_218 [6];
  long local_1e8;
  PointerType local_1a0;
  long lStack_198;
  undefined8 local_190;
  XprTypeNested pMStack_188;
  long local_180;
  long lStack_178;
  Index local_170;
  PointerType local_160;
  long lStack_158;
  undefined8 local_150;
  XprTypeNested pMStack_148;
  long local_140;
  long lStack_138;
  Index local_130;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_a8;
  
  bVar8 = 0;
  (this->super_Geometry)._vptr_Geometry = (_func_int **)&PTR_DimLocal_002a9c18;
  coords_00 = &this->coords_;
  (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.m_data =
       (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_data;
  (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.m_rows =
       (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_rows;
  (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_data =
       (double *)0x0;
  (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).m_storage.m_rows = 0;
  IVar2 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
          m_rows;
  (this->jacobian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_data
       = (double *)0x0;
  (this->jacobian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_rows
       = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::resize
            (&(this->jacobian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,IVar2
             ,2);
  IVar2 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
          m_rows;
  (this->jacobian_inverse_gramian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
  m_storage.m_data = (double *)0x0;
  (this->jacobian_inverse_gramian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
  m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::resize
            (&(this->jacobian_inverse_gramian_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,IVar2,2);
  this->integrationElement_ = 0.0;
  assertNonDegenerateQuad(coords_00,1e-08);
  IVar2 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
             &local_510,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
             m_storage.m_data + IVar2 * 3,IVar2,1);
  local_510.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_510.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startCol.
  m_value = 3;
  local_510.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
       m_rows;
  local_510.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr = coords_00
  ;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
             &local_268,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
             m_storage.m_data +
             local_510.
             super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
             m_outerStride * 2,
             local_510.
             super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
             m_outerStride,1);
  local_268.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_268.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startCol.
  m_value = 2;
  local_268.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
       m_rows;
  local_268.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr = coords_00
  ;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                   *)local_5c0,&local_510,&local_268,local_230);
  IVar2 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
             &local_2a0,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
             m_storage.m_data + IVar2,IVar2,1);
  local_2a0.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_2a0.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startCol.
  m_value = 1;
  local_2a0.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
       m_rows;
  local_2a0.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr = coords_00
  ;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                   *)local_4d8,(Lhs *)local_5c0,&local_2a0,
                  (scalar_sum_op<double,_double> *)local_230);
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
             &local_2d8,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
             m_storage.m_data,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
             m_storage.m_rows,1);
  local_2d8.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_2d8.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startCol.
  m_value = 0;
  local_2d8.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
       m_rows;
  local_2d8.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr = coords_00
  ;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                   *)local_418,(Lhs *)local_4d8,&local_2d8,local_230);
  pcVar1 = local_418 + 0x10;
  pcVar6 = pcVar1;
  puVar7 = local_218;
  for (lVar5 = 0xe; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *(undefined8 *)pcVar6;
    pcVar6 = pcVar6 + (ulong)bVar8 * -0x10 + 8;
    puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
  }
  local_170 = local_360;
  local_180 = local_370.m_value;
  lStack_178 = vStack_368.m_value;
  local_190 = local_380;
  pMStack_188 = pMStack_378;
  local_1a0 = local_390;
  lStack_198 = vStack_388.m_value;
  local_160 = local_350;
  lStack_158 = vStack_348.m_value;
  local_150 = local_340;
  pMStack_148 = pMStack_338;
  local_140 = local_330.m_value;
  lStack_138 = vStack_328.m_value;
  local_130 = local_320;
  if (vStack_348.m_value == 0) {
    uVar9 = 0;
    uVar10 = 0;
  }
  else {
    SVar3 = Eigen::
            DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>const>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>const>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>const>const>>
            ::redux<Eigen::internal::scalar_sum_op<double,double>>
                      ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>const>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>const>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>const>const>>
                        *)local_230,(scalar_sum_op<double,_double> *)&local_a8);
    uVar9 = SUB84(SVar3,0);
    uVar10 = (undefined4)((ulong)SVar3 >> 0x20);
  }
  local_5c9._1_8_ = CONCAT44(uVar10,uVar9);
  IVar2 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
             &local_548,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
             m_storage.m_data + IVar2 * 2,IVar2,1);
  local_548.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_548.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startCol.
  m_value = 2;
  local_548.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
       m_rows;
  local_548.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr = coords_00
  ;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *)
             &local_310,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
             m_storage.m_data,
             local_548.
             super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
             m_outerStride,1);
  local_310.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_310.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_startCol.
  m_value = 0;
  local_310.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
       m_rows;
  local_310.super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr = coords_00
  ;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
  ::CwiseBinaryOp(&local_a8,&local_548,&local_310,local_230);
  func = &local_a8;
  puVar7 = &local_228;
  for (lVar5 = 0xe; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = (func->m_lhs).
              super_BlockImpl<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.
              m_data;
    func = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
            *)((long)func + (ulong)bVar8 * -0x10 + 8);
    puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
  }
  if (local_1e8 == 0) {
    uVar9 = 0;
    uVar10 = 0;
  }
  else {
    func = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
            *)local_5c9;
    SVar4 = Eigen::
            DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,4,0,-1,4>,-1,1,true>const>const>>
            ::redux<Eigen::internal::scalar_sum_op<double,double>>
                      ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>,_1,1,true>const>const>>
                        *)local_230,(scalar_sum_op<double,_double> *)func);
    uVar9 = SUB84(SVar4,0);
    uVar10 = (undefined4)((ulong)SVar4 >> 0x20);
  }
  if (SQRT((double)local_5c9._1_8_) < SQRT((double)CONCAT44(uVar10,uVar9)) * 1e-08) {
    init(this,(EVP_PKEY_CTX *)func);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_230);
  std::__ostream_insert<char,std::char_traits<char>>(local_220,"No parallelogram!",0x11);
  local_418._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_418,
             "(coords_.col(3) - coords_.col(2) + coords_.col(1) - coords_.col(0)) .norm() < 1.0E-8 * (coords_.col(2) - coords_.col(0)).norm()"
             ,"");
  pcVar6 = local_4d8 + 0x10;
  local_4d8._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4d8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  lf::base::AssertionFailed((string *)local_418,(string *)local_4d8,0x10d,(string *)local_5c0);
  if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
    operator_delete((void *)local_5c0._0_8_,local_5b0[0]._M_allocated_capacity + 1);
  }
  if ((pointer)local_4d8._0_8_ != pcVar6) {
    operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
  }
  if ((pointer)local_418._0_8_ != pcVar1) {
    operator_delete((void *)local_418._0_8_,local_418._16_8_ + 1);
  }
  local_418._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"false","");
  local_4d8._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4d8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
             ,"");
  local_5c0._0_8_ = local_5c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"");
  lf::base::AssertionFailed((string *)local_418,(string *)local_4d8,0x10d,(string *)local_5c0);
  std::__cxx11::string::~string((string *)local_5c0);
  std::__cxx11::string::~string((string *)local_4d8);
  std::__cxx11::string::~string((string *)local_418);
  abort();
}

Assistant:

Parallelogram::Parallelogram(Eigen::Matrix<double, Eigen::Dynamic, 4> coords)
    : coords_(std::move(coords)),
      jacobian_(coords_.rows(), 2),
      jacobian_inverse_gramian_(coords_.rows(), 2),
      integrationElement_(0) {
  // Check validity of geometry (non-zero area)
  assertNonDegenerateQuad(coords_);
  // Check parallelogram property
  LF_ASSERT_MSG(
      (coords_.col(3) - coords_.col(2) + coords_.col(1) - coords_.col(0))
              .norm() < 1.0E-8 * (coords_.col(2) - coords_.col(0)).norm(),
      "No parallelogram!");
  init();
}